

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  long in_FS_OFFSET;
  allocator<wchar_t> local_39;
  wstring local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (wchar_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      std::operator<<(os,"NULL");
      return;
    }
  }
  else {
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_38,str,&local_39);
    PrintWideStringTo(&local_38,os);
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }